

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneBspTreeIndex::~QGraphicsSceneBspTreeIndex(QGraphicsSceneBspTreeIndex *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  *(undefined ***)this = &PTR_metaObject_00813a60;
  lVar1 = *(long *)(*(long *)(this + 8) + 0x118);
  if (lVar1 != 0) {
    lVar2 = *(long *)(*(long *)(this + 8) + 0x110);
    lVar4 = 0;
    do {
      lVar3 = *(long *)(lVar2 + lVar4 * 8);
      if (lVar3 != 0) {
        *(undefined4 *)(*(long *)(lVar3 + 8) + 0x110) = 0xffffffff;
      }
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QGraphicsSceneBspTreeIndex::~QGraphicsSceneBspTreeIndex()
{
    Q_D(QGraphicsSceneBspTreeIndex);
    for (int i = 0; i < d->indexedItems.size(); ++i) {
        // Ensure item bits are reset properly.
        if (QGraphicsItem *item = d->indexedItems.at(i)) {
            Q_ASSERT(!item->d_ptr->itemDiscovered);
            item->d_ptr->index = -1;
        }
    }
}